

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdmanager.cc
# Opt level: O3

int __thiscall bdNodeManager::checkBadPeerStatus(bdNodeManager *this)

{
  uint32_t flags_00;
  bool bVar1;
  uint32_t flags;
  string nullstr;
  bdId id;
  uint32_t local_9c;
  undefined1 *local_98;
  long local_90;
  undefined1 local_88;
  undefined7 uStack_87;
  string local_78;
  bdId local_54;
  
  bdId::bdId(&local_54);
  local_98 = &local_88;
  local_90 = 0;
  local_88 = 0;
  while( true ) {
    bVar1 = bdPeerQueue::popPeer(&(this->super_bdNode).mBadPeerQueue,&local_54,&local_9c);
    flags_00 = local_9c;
    if (!bVar1) break;
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_78,local_98,local_98 + local_90);
    doInfoCallback(this,&local_54,1,flags_00,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_98 != &local_88) {
    operator_delete(local_98,CONCAT71(uStack_87,local_88) + 1);
  }
  return 1;
}

Assistant:

int bdNodeManager::checkBadPeerStatus() {
	bdId id;
	uint32_t flags;
	std::string nullstr;

	while(mBadPeerQueue.popPeer(&id, flags))
		doInfoCallback(&id, BITDHT_INFO_CB_TYPE_BADPEER, flags, nullstr);
	return 1;
}